

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O0

PBuffer __thiscall Buffer::get_subbuffer(Buffer *this,size_t offset,size_t _size)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  PBuffer PVar1;
  enable_shared_from_this<Buffer> local_38;
  EndianessMode local_28 [2];
  size_t _size_local;
  size_t offset_local;
  Buffer *this_local;
  
  _size_local = _size;
  offset_local = offset;
  this_local = this;
  std::enable_shared_from_this<Buffer>::shared_from_this(&local_38);
  std::
  make_shared<Buffer,std::shared_ptr<Buffer>,unsigned_long&,unsigned_long&,Buffer::EndianessMode&>
            ((shared_ptr<Buffer> *)this,(unsigned_long *)&local_38,&_size_local,local_28);
  std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)&local_38);
  PVar1.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar1.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (PBuffer)PVar1.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

PBuffer
Buffer::get_subbuffer(size_t offset, size_t _size) {
  return std::make_shared<Buffer>(shared_from_this(), offset, _size, endianess);
}